

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

bool __thiscall slang::ast::Expression::isImplicitString(Expression *this)

{
  int iVar1;
  not_null<const_slang::ast::Type_*> this_00;
  SyntaxNode *pSVar2;
  undefined8 *puVar3;
  ParameterSymbol *this_01;
  bool bVar4;
  bool bVar5;
  ConversionExpression *conv;
  long lVar6;
  
LAB_002da0f9:
  this_00.ptr = ((not_null<const_slang::ast::Type_*> *)((long)&((Type *)this)->super_Symbol + 8))->
                ptr;
  if ((this_00.ptr)->canonical == (Type *)0x0) {
    Type::resolveCanonical(this_00.ptr);
  }
  if (((this_00.ptr)->canonical->super_Symbol).kind == StringType) {
    return true;
  }
  iVar1 = *(int *)&((Type *)this)->super_Symbol;
  switch(iVar1) {
  case 7:
    return true;
  case 8:
    this_01 = *(ParameterSymbol **)((long)&((Type *)this)->super_Symbol + 0x30);
    if ((this_01->super_ValueSymbol).super_Symbol.kind == Parameter) {
      bVar4 = ParameterSymbol::isImplicitString
                        (this_01,*(SourceRange *)((long)&((Type *)this)->super_Symbol + 0x20));
      return bVar4;
    }
  case 9:
  case 0xd:
  case 0xe:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    return false;
  case 10:
    this = *(Expression **)((long)this + 0x48);
    goto LAB_002da0f9;
  case 0xb:
    bVar4 = isImplicitString(*(Expression **)((long)&((Type *)this)->super_Symbol + 0x30));
    if (bVar4) {
      return true;
    }
    break;
  case 0xc:
    bVar4 = isImplicitString(*(Expression **)((long)this + 0x48));
    if (bVar4) {
      return true;
    }
    this = *(Expression **)((long)this + 0x48U + 8);
    goto LAB_002da0f9;
  case 0xf:
    pSVar2 = *(SyntaxNode **)((long)&((Type *)this)->super_Symbol + 0x38);
    bVar4 = pSVar2 != (SyntaxNode *)0x0;
    if (pSVar2 == (SyntaxNode *)0x0) {
      return bVar4;
    }
    puVar3 = *(undefined8 **)((long)&((Type *)this)->super_Symbol + 0x30);
    bVar5 = isImplicitString((Expression *)*puVar3);
    if (!bVar5) {
      lVar6 = 8;
      do {
        bVar5 = (long)pSVar2 << 3 == lVar6;
        bVar4 = !bVar5;
        if (bVar5) {
          return bVar4;
        }
        bVar5 = isImplicitString(*(Expression **)((long)puVar3 + lVar6));
        lVar6 = lVar6 + 8;
      } while (!bVar5);
      return bVar4;
    }
    return bVar4;
  case 0x10:
    break;
  case 0x16:
    if (1 < (int)((Expression *)((long)&((Type *)this)->super_Symbol + 0x30))->kind) {
      return false;
    }
    break;
  default:
    goto switchD_002da12d_default;
  }
  this = (Expression *)
         ((not_null<const_slang::ast::Type_*> *)((long)&((Type *)this)->super_Symbol + 0x38))->ptr;
  goto LAB_002da0f9;
switchD_002da12d_default:
  if (iVar1 == 0x1f) {
    bVar4 = isImplicitString(*(Expression **)((long)&((Type *)this)->super_Symbol + 0x38));
    if (bVar4) {
      return true;
    }
    if (*(SymbolIndex *)((long)&((Type *)this)->super_Symbol + 0x30) != 0) {
      return false;
    }
    this = (Expression *)((Type *)this)->canonical;
  }
  else {
    if (iVar1 != 0x25) {
      return false;
    }
    this = *(Expression **)((long)&((Type *)this)->super_Symbol + 0x30);
  }
  goto LAB_002da0f9;
}

Assistant:

bool Expression::isImplicitString() const {
    if (type->isString())
        return true;

    switch (kind) {
        case ExpressionKind::StringLiteral:
            return true;
        case ExpressionKind::UnaryOp:
            return as<UnaryExpression>().operand().isImplicitString();
        case ExpressionKind::BinaryOp: {
            auto& op = as<BinaryExpression>();
            return op.left().isImplicitString() || op.right().isImplicitString();
        }
        case ExpressionKind::ConditionalOp: {
            auto& op = as<ConditionalExpression>();
            return op.left().isImplicitString() || op.right().isImplicitString();
        }
        case ExpressionKind::Concatenation: {
            auto& concat = as<ConcatenationExpression>();
            for (auto op : concat.operands()) {
                if (op->isImplicitString())
                    return true;
            }
            return false;
        }
        case ExpressionKind::Replication: {
            auto& repl = as<ReplicationExpression>();
            return repl.concat().isImplicitString();
        }
        case ExpressionKind::ValueRange: {
            auto& range = as<ValueRangeExpression>();
            return range.left().isImplicitString() ||
                   (range.rangeKind == ValueRangeKind::Simple && range.right().isImplicitString());
        }
        case ExpressionKind::MinTypMax: {
            auto& mtm = as<MinTypMaxExpression>();
            return mtm.selected().isImplicitString();
        }
        case ExpressionKind::NamedValue: {
            auto& nv = as<NamedValueExpression>();
            return nv.symbol.kind == SymbolKind::Parameter &&
                   nv.symbol.as<ParameterSymbol>().isImplicitString(sourceRange);
        }
        case ExpressionKind::Conversion: {
            auto& conv = as<ConversionExpression>();
            return conv.isImplicit() && conv.operand().isImplicitString();
        }
        default:
            return false;
    }
}